

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_peer_connection_tests.cpp
# Opt level: O2

void __thiscall
net_peer_connection_tests::test_addnode_getaddednodeinfo_and_connection_detection::test_method
          (test_addnode_getaddednodeinfo_and_connection_detection *this)

{
  CAddress *this_00;
  long lVar1;
  NetGroupManager *__args_3;
  CChainParams *__args_4;
  Warnings *pWVar2;
  Options opts;
  string message;
  string message_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> address
  ;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  address_00;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  address_01;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  address_02;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  address_03;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  address_04;
  MatchFn match;
  MatchFn match_00;
  pointer pcVar3;
  undefined1 auVar4 [8];
  __single_object _Var5;
  Network NVar6;
  CNode *pCVar7;
  unit_test_log_t *puVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  pointer pAVar10;
  _Alloc_hider _Var11;
  __uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> _Var12;
  iterator pvVar13;
  iterator pvVar14;
  string *psVar15;
  AddrManImpl *pAVar16;
  int iVar17;
  CService *this_01;
  long in_FS_OFFSET;
  bool bVar18;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  undefined4 uVar19;
  undefined4 uVar20;
  long lVar21;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *p_Var22;
  undefined1 *puVar23;
  undefined8 uVar24;
  char *pcVar25;
  undefined8 in_stack_fffffffffffffae0;
  PeerTest *this_02;
  CNode *in_stack_fffffffffffffaf0;
  _Manager_type in_stack_fffffffffffffaf8;
  pointer pAVar26;
  _Invoker_type in_stack_fffffffffffffb00;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  undefined1 *local_4b8;
  undefined1 *local_4b0;
  char *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  unit_test_log_t local_3a8;
  undefined1 local_3a0 [31];
  undefined1 local_381;
  char *local_380;
  char *local_378;
  undefined1 *local_370;
  undefined1 *local_368;
  char *local_360;
  char *local_358;
  undefined1 local_350 [24];
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  _Any_data local_2a8;
  code *local_298;
  code *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  _Any_data local_258;
  code *local_248;
  code *local_240;
  vector<CNode_*,_std::allocator<CNode_*>_> nodes;
  NodeId id;
  undefined1 local_218 [8];
  __single_object connman;
  undefined2 uStack_206;
  undefined2 uStack_1fa;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1f8;
  string local_1d0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_188;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_160;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_138;
  string local_110 [32];
  undefined1 local_f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_e0;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d0;
  string local_a8 [32];
  DebugLogHelper debugloghelper18;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  debugloghelper18.m_message._M_dataplus._M_p._0_4_ = 0x1337;
  local_f0._0_4_ = 0x1337;
  __args_3 = (NetGroupManager *)
             (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.addrman._M_t.
             super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
             super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
             super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  __args_4 = (CChainParams *)
             (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
             super_ChainTestingSetup.super_BasicTestingSetup.m_node.netgroupman._M_t.
             super___uniq_ptr_impl<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_NetGroupManager_*,_std::default_delete<const_NetGroupManager>_>
             .super__Head_base<0UL,_const_NetGroupManager_*,_false>._M_head_impl;
  Params();
  std::make_unique<ConnmanTestMsg,int,int,AddrMan&,NetGroupManager_const&,CChainParams_const&>
            ((int *)&connman,(int *)&debugloghelper18,(AddrMan *)local_f0,__args_3,__args_4);
  pWVar2 = (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
           super_ChainTestingSetup.super_BasicTestingSetup.m_node.warnings._M_t.
           super___uniq_ptr_impl<node::Warnings,_std::default_delete<node::Warnings>_>._M_t.
           super__Tuple_impl<0UL,_node::Warnings_*,_std::default_delete<node::Warnings>_>.
           super__Head_base<0UL,_node::Warnings_*,_false>._M_head_impl;
  lVar21 = (ulong)CONCAT42(100,uStack_206) << 0x10;
  uVar24 = CONCAT26(uStack_1fa,100);
  uVar19 = SUB84(pWVar2,0);
  uVar20 = (undefined4)((ulong)pWVar2 >> 0x20);
  opts.max_extra_txs = (int)lVar21;
  opts.capture_messages = (bool)(char)((ulong)lVar21 >> 0x20);
  opts.deterministic_rng = (bool)(char)((ulong)lVar21 >> 0x28);
  opts._14_2_ = (short)((ulong)lVar21 >> 0x30);
  opts._0_8_ = pWVar2;
  PeerManager::make((CConnman *)local_218,
                    (AddrMan *)
                    connman._M_t.
                    super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t
                    .super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
                    super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,
                    (BanMan *)
                    (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.addrman._M_t.
                    super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(ChainstateManager *)0x0,
                    (CTxMemPool *)
                    (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.chainman._M_t.
                    super___uniq_ptr_impl<ChainstateManager,_std::default_delete<ChainstateManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_ChainstateManager_*,_std::default_delete<ChainstateManager>_>
                    .super__Head_base<0UL,_ChainstateManager_*,_false>._M_head_impl,
                    (Warnings *)
                    (this->super_PeerTest).super_LogIPsTestingSetup.super_TestingSetup.
                    super_ChainTestingSetup.super_BasicTestingSetup.m_node.mempool._M_t.
                    super___uniq_ptr_impl<CTxMemPool,_std::default_delete<CTxMemPool>_>._M_t.
                    super__Tuple_impl<0UL,_CTxMemPool_*,_std::default_delete<CTxMemPool>_>.
                    super__Head_base<0UL,_CTxMemPool_*,_false>._M_head_impl,opts);
  id = 0;
  nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            (local_a8,"Added connection to 127.0.0.1:8333 peer=1",(allocator<char> *)local_f0);
  local_258._M_unused._M_object = (void *)0x0;
  local_258._8_8_ = 0;
  local_240 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/logging.h:35:66)>
              ::_M_invoke;
  local_248 = std::
              _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/logging.h:35:66)>
              ::_M_manager;
  message._M_dataplus._M_p._4_4_ = uVar20;
  message._M_dataplus._M_p._0_4_ = uVar19;
  message._M_string_length = lVar21;
  message.field_2._M_allocated_capacity = uVar24;
  message.field_2._8_8_ = in_stack_fffffffffffffae0;
  match.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffaf0;
  match.super__Function_base._M_functor._M_unused._M_object = this;
  match.super__Function_base._M_manager = in_stack_fffffffffffffaf8;
  match._M_invoker = in_stack_fffffffffffffb00;
  DebugLogHelper::DebugLogHelper(&debugloghelper18,message,match);
  std::_Function_base::~_Function_base((_Function_base *)&local_258);
  std::__cxx11::string::~string(local_a8);
  _Var12._M_t.super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
  super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl =
       (tuple<ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>)
       (tuple<ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>)connman;
  auVar4 = local_218;
  p_Var22 = &local_d0;
  std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[10]>
            ((_Optional_payload_base<std::__cxx11::string> *)p_Var22,"127.0.0.1");
  pvVar13 = (iterator)0x2;
  address.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = uVar24;
  address.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)p_Var22;
  address.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffae0;
  address.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = this;
  address.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffaf0;
  PeerTest::AddPeer(&this->super_PeerTest,&id,&nodes,(PeerManager *)auVar4,
                    (ConnmanTestMsg *)
                    _Var12._M_t.
                    super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
                    super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,MANUAL,false,address
                   );
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_d0);
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x61;
  file.m_begin = (iterator)&local_268;
  msg.m_end = pvVar13;
  msg.m_begin = (iterator)
                _Var12._M_t.
                super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
                super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_278,msg);
  local_1d0._M_dataplus._M_p._0_1_ =
       nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.super__Vector_impl_data.
       _M_finish[-1] != (CNode *)0x0;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_allocated_capacity = 0;
  aStack_e0._8_8_ = local_350;
  local_350._0_8_ = "nodes.back() != nullptr";
  local_350._8_8_ = "";
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_280 = "";
  uVar19 = 0;
  uVar20 = 0;
  pvVar13 = (iterator)0x2;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d0,(lazy_ostream *)local_f0,2,0,WARN,(check_type)p_Var22,
             (size_t)&local_288,0x61);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d0.field_2._M_allocated_capacity);
  DebugLogHelper::~DebugLogHelper(&debugloghelper18);
  iVar17 = 10;
  while (bVar18 = iVar17 != 0, iVar17 = iVar17 + -1, bVar18) {
    std::__cxx11::string::string<std::allocator<char>>
              (local_110,
               "Not opening a connection to localhost, already connected to 127.0.0.1:8333",
               (allocator<char> *)local_f0);
    local_2a8._M_unused._M_object = (void *)0x0;
    local_2a8._8_8_ = 0;
    local_290 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_invoke;
    local_298 = std::
                _Function_handler<bool_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*),_DebugLogHelper::(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/util/logging.h:35:66)>
                ::_M_manager;
    message_00._M_dataplus._M_p._4_4_ = uVar20;
    message_00._M_dataplus._M_p._0_4_ = uVar19;
    message_00._M_string_length = (size_type)p_Var22;
    message_00.field_2._M_allocated_capacity = uVar24;
    message_00.field_2._8_8_ = in_stack_fffffffffffffae0;
    match_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffaf0;
    match_00.super__Function_base._M_functor._M_unused._M_object = this;
    match_00.super__Function_base._M_manager = in_stack_fffffffffffffaf8;
    match_00._M_invoker = in_stack_fffffffffffffb00;
    DebugLogHelper::DebugLogHelper(&debugloghelper18,message_00,match_00);
    std::_Function_base::~_Function_base((_Function_base *)&local_2a8);
    std::__cxx11::string::~string(local_110);
    local_2b8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_2b0 = "";
    local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_00.m_end = (iterator)0x69;
    file_00.m_begin = (iterator)&local_2b8;
    msg_00.m_end = pvVar14;
    msg_00.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_2c8,
               msg_00);
    pCVar7 = ConnmanTestMsg::ConnectNodePublic
                       ((ConnmanTestMsg *)
                        connman._M_t.
                        super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>
                        .super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,
                        (PeerManager *)local_218,"localhost",MANUAL);
    local_1d0._M_dataplus._M_p._0_1_ = pCVar7 == (CNode *)0x0;
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_allocated_capacity = 0;
    local_350._0_8_ = "!connman->ConnectNodePublic(*peerman, \"localhost\", ConnectionType::MANUAL)"
    ;
    local_350._8_8_ = "";
    local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
    local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
    aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    aStack_e0._8_8_ = local_350;
    local_2d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_2d0 = "";
    uVar19 = 0;
    uVar20 = 0;
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1d0,(lazy_ostream *)local_f0,1,0,WARN,(check_type)p_Var22,
               (size_t)&local_2d8,0x69);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_1d0.field_2._M_allocated_capacity);
    DebugLogHelper::~DebugLogHelper(&debugloghelper18);
  }
  local_138._M_engaged = false;
  address_00.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = uVar24;
  address_00.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)&local_138;
  address_00.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffae0;
  address_00.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = this;
  address_00.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffaf0;
  this_02 = &this->super_PeerTest;
  PeerTest::AddPeer(&this->super_PeerTest,&id,&nodes,(PeerManager *)local_218,
                    (ConnmanTestMsg *)
                    connman._M_t.
                    super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t
                    .super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
                    super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,OUTBOUND_FULL_RELAY,
                    false,address_00);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_138);
  local_160._M_engaged = false;
  address_01.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = uVar24;
  address_01.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)&local_160;
  address_01.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffae0;
  address_01.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = this_02;
  address_01.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffaf0;
  PeerTest::AddPeer(&this->super_PeerTest,&id,&nodes,(PeerManager *)local_218,
                    (ConnmanTestMsg *)
                    connman._M_t.
                    super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t
                    .super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
                    super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,BLOCK_RELAY,true,
                    address_01);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_160);
  local_188._M_engaged = false;
  address_02.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = uVar24;
  address_02.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)&local_188;
  address_02.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffae0;
  address_02.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = this_02;
  address_02.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffaf0;
  PeerTest::AddPeer(&this->super_PeerTest,&id,&nodes,(PeerManager *)local_218,
                    (ConnmanTestMsg *)
                    connman._M_t.
                    super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t
                    .super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
                    super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,INBOUND,false,
                    address_02);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_188);
  _Var12._M_t.super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
  super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl =
       (tuple<ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>)
       (tuple<ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>)connman;
  auVar4 = local_218;
  p_Var22 = &local_1b0;
  std::_Optional_payload_base<std::__cxx11::string>::_Optional_payload_base<char_const(&)[47]>
            ((_Optional_payload_base<std::__cxx11::string> *)p_Var22,
             "[fc00:3344:5566:7788:9900:aabb:ccdd:eeff]:1234");
  pvVar13 = (iterator)0x0;
  address_03.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = uVar24;
  address_03.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)p_Var22;
  address_03.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffae0;
  address_03.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = this_02;
  address_03.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffaf0;
  PeerTest::AddPeer(this_02,&id,&nodes,(PeerManager *)auVar4,
                    (ConnmanTestMsg *)
                    _Var12._M_t.
                    super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
                    super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,INBOUND,false,
                    address_03);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_1b0);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x74;
  file_01.m_begin = (iterator)&local_2e8;
  msg_01.m_end = pvVar13;
  msg_01.m_begin =
       (iterator)
       _Var12._M_t.super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
       super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_2f8,
             msg_01);
  local_f0[0] = nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                super__Vector_impl_data._M_finish[-1]->m_conn_type == INBOUND;
  local_f0._8_8_ = (__pthread_internal_list *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_1d0._M_dataplus._M_p = "nodes.back()->IsInboundConn()";
  local_1d0._M_string_length = (long)"nodes.back()->IsInboundConn()" + 0x1d;
  debugloghelper18.m_message._M_string_length._0_1_ = 0;
  debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  debugloghelper18.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper18.m_message.field_2._8_8_ = &local_1d0;
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_300 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f0,(lazy_ostream *)&debugloghelper18,1,0,WARN,
             (check_type)p_Var22,(size_t)&local_308,0x74);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x75;
  file_02.m_begin = (iterator)&local_318;
  msg_02.m_end = pvVar14;
  msg_02.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_328,
             msg_02);
  debugloghelper18.m_message._M_string_length._0_1_ = 0;
  debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  debugloghelper18.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper18.m_message.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_330 = "";
  NVar6 = CNode::ConnectedThroughNetwork
                    (nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                     super__Vector_impl_data._M_finish[-1]);
  pvVar13 = local_f0;
  local_f0._0_4_ = NVar6;
  local_1d0._M_dataplus._M_p._0_4_ = 5;
  psVar15 = &local_1d0;
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,Network,Network>
            (&debugloghelper18,&local_338,0x75,1,2,pvVar13,0xbbf39e,psVar15,"Network::NET_CJDNS");
  local_f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_f0._8_8_ = "";
  aStack_e0._M_allocated_capacity = 0x77;
  puVar8 = boost::unit_test::unit_test_log_t::operator<<
                     (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_f0);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_1d0,(log_level)puVar8);
  debugloghelper18.m_message._M_string_length._0_1_ = 0;
  debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0114a5e8;
  debugloghelper18.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper18.m_message.field_2._8_8_ = anon_var_dwarf_a51634;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_1d0,(lazy_ostream *)&debugloghelper18);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_1d0);
  ConnmanTestMsg::TestNodes
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)local_350,
             (ConnmanTestMsg *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl);
  pAVar26 = (pointer)local_350._8_8_;
  for (pAVar10 = (pointer)local_350._0_8_; pAVar10 != pAVar26;
      pAVar10 = (pointer)&(pAVar10->m_params).m_added_node._M_string_length) {
    in_stack_fffffffffffffaf0 = (CNode *)(pAVar10->m_params).m_added_node._M_dataplus._M_p;
    local_360 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_358 = "";
    local_370 = &boost::unit_test::basic_cstring<char_const>::null;
    local_368 = &boost::unit_test::basic_cstring<char_const>::null;
    file_03.m_end = (iterator)0x79;
    file_03.m_begin = (iterator)&local_360;
    msg_03.m_end = pvVar13;
    msg_03.m_begin = (iterator)pbVar9;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_370,
               msg_03);
    _Var5 = connman;
    this_00 = &in_stack_fffffffffffffaf0->addr;
    CService::ToStringAddrPort_abi_cxx11_(&debugloghelper18.m_message,&this_00->super_CService);
    debugloghelper18.m_found = true;
    bVar18 = CConnman::AddNode((CConnman *)
                               _Var5._M_t.
                               super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>
                               .super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,
                               (AddedNodeParams *)&debugloghelper18);
    local_1d0._M_dataplus._M_p._0_1_ = bVar18;
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_allocated_capacity = 0;
    local_3a0._0_8_ = "connman->AddNode({ node->addr.ToStringAddrPort(), true})";
    local_3a0._8_8_ = "";
    local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
    local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
    aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
    local_380 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_378 = "";
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000001;
    pvVar13 = (iterator)0x0;
    aStack_e0._8_8_ = (pointer)local_3a0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1d0,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar15,
               (size_t)&local_380,0x79);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_1d0.field_2._M_allocated_capacity);
    std::__cxx11::string::~string((string *)&debugloghelper18);
    local_3a0._0_8_ =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_3a0._8_8_ = "";
    local_3a0._16_8_ = 0x7a;
    puVar8 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_3a0);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_381,(log_level)puVar8);
    local_3a8.super_test_observer._vptr_test_observer = (test_observer)in_stack_fffffffffffffaf0->id
    ;
    CService::ToStringAddrPort_abi_cxx11_(&local_1d0,&this_00->super_CService);
    tinyformat::format<long,std::__cxx11::string>
              ((string *)local_f0,(tinyformat *)"peer id=%s addr=%s",(char *)&local_3a8,
               (long *)&local_1d0,pbVar9);
    debugloghelper18.m_message._M_string_length._0_1_ = 0;
    debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01147fb0;
    debugloghelper18.m_message.field_2._M_allocated_capacity =
         (size_type)boost::unit_test::lazy_ostream::inst;
    debugloghelper18.m_message.field_2._8_8_ = (string *)local_f0;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)&local_381,(lazy_ostream *)&debugloghelper18);
    std::__cxx11::string::~string((string *)local_f0);
    std::__cxx11::string::~string((string *)&local_1d0);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)&local_381);
  }
  std::_Vector_base<CNode_*,_std::allocator<CNode_*>_>::~_Vector_base
            ((_Vector_base<CNode_*,_std::allocator<CNode_*>_> *)local_350);
  local_f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_f0._8_8_ = "";
  aStack_e0._M_allocated_capacity = 0x7d;
  puVar8 = boost::unit_test::unit_test_log_t::operator<<
                     (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_f0);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_1d0,(log_level)puVar8);
  debugloghelper18.m_message._M_string_length._0_1_ = 0;
  debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0114a7c8;
  debugloghelper18.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper18.m_message.field_2._8_8_ = anon_var_dwarf_a51671;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_1d0,(lazy_ostream *)&debugloghelper18);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_1d0);
  local_3b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x7e;
  file_04.m_begin = (iterator)&local_3b8;
  msg_04.m_end = pvVar13;
  msg_04.m_begin = (iterator)pbVar9;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_3c8,
             msg_04);
  _Var5 = connman;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debugloghelper18,"127.0.0.1",(allocator<char> *)local_3a0);
  debugloghelper18.m_found = true;
  bVar18 = CConnman::AddNode((CConnman *)
                             _Var5._M_t.
                             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>
                             .super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,
                             (AddedNodeParams *)&debugloghelper18);
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_allocated_capacity = 0;
  local_350._0_8_ = "!connman->AddNode({ \"127.0.0.1\", true})";
  local_350._8_8_ = "";
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = local_350;
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_3d0 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  local_1d0._M_dataplus._M_p._0_1_ = !bVar18;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d0,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar15,
             (size_t)&local_3d8,0x7e);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d0.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&debugloghelper18);
  local_3e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_3e0 = "";
  local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x81;
  file_05.m_begin = (iterator)&local_3e8;
  msg_05.m_end = pvVar14;
  msg_05.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_3f8,
             msg_05);
  _Var5 = connman;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&debugloghelper18,"127.1",(allocator<char> *)local_3a0);
  debugloghelper18.m_found = true;
  bVar18 = CConnman::AddNode((CConnman *)
                             _Var5._M_t.
                             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>
                             .super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,
                             (AddedNodeParams *)&debugloghelper18);
  local_1d0._M_dataplus._M_p._0_1_ = !bVar18;
  local_1d0._M_string_length = 0;
  local_1d0.field_2._M_allocated_capacity = 0;
  local_350._0_8_ = "!connman->AddNode({ \"127.1\", true})";
  local_350._8_8_ = "";
  local_f0._8_8_ = local_f0._8_8_ & 0xffffffffffffff00;
  local_f0._0_8_ = &PTR__lazy_ostream_011481f0;
  aStack_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_e0._8_8_ = local_350;
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_400 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_1d0,(lazy_ostream *)local_f0,1,0,WARN,(check_type)psVar15,
             (size_t)&local_408,0x81);
  boost::detail::shared_count::~shared_count
            ((shared_count *)&local_1d0.field_2._M_allocated_capacity);
  std::__cxx11::string::~string((string *)&debugloghelper18);
  local_f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_f0._8_8_ = "";
  aStack_e0._M_allocated_capacity = 0x84;
  puVar8 = boost::unit_test::unit_test_log_t::operator<<
                     (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_f0);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_1d0,(log_level)puVar8);
  debugloghelper18.m_message._M_string_length._0_1_ = 0;
  debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0114a808;
  debugloghelper18.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper18.m_message.field_2._8_8_ = anon_var_dwarf_a516b9;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_1d0,(lazy_ostream *)&debugloghelper18);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_1d0);
  local_418 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x85;
  file_06.m_begin = (iterator)&local_418;
  msg_06.m_end = pvVar14;
  msg_06.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_428,
             msg_06);
  debugloghelper18.m_message._M_string_length._0_1_ = 0;
  debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011480b0;
  debugloghelper18.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper18.m_message.field_2._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_430 = "";
  CConnman::GetAddedNodeInfo
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)local_f0,
             (CConnman *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,true);
  local_1d0._M_dataplus._M_p = (pointer)((long)(local_f0._8_8_ - local_f0._0_8_) / 0x58);
  psVar15 = &local_1d0;
  local_350._0_8_ =
       (long)nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3;
  pcVar25 = "nodes.size()";
  puVar23 = local_350;
  pvVar13 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_long>
            (&debugloghelper18,&local_438,0x85,1,2,psVar15,0xbbf55c);
  std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::~vector
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)local_f0);
  local_448 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x86;
  file_07.m_begin = (iterator)&local_448;
  msg_07.m_end = (iterator)psVar15;
  msg_07.m_begin = pvVar13;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_458,
             msg_07);
  CConnman::GetAddedNodeInfo
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)&local_1d0,
             (CConnman *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,false);
  local_f0[0] = local_1d0._M_dataplus._M_p == (pointer)local_1d0._M_string_length;
  local_f0._8_8_ = (AddrManImpl *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_350._0_8_ = "connman->GetAddedNodeInfo( false).empty()";
  local_350._8_8_ = "";
  debugloghelper18.m_message._M_string_length._0_1_ = 0;
  debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  debugloghelper18.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper18.m_message.field_2._8_8_ = local_350;
  local_468 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_460 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f0,(lazy_ostream *)&debugloghelper18,1,0,WARN,
             (check_type)puVar23,(size_t)&local_468,0x86);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
  std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::~vector
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)&local_1d0);
  ConnmanTestMsg::TestNodes
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)local_f0,
             (ConnmanTestMsg *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl);
  uVar24 = local_f0._8_8_;
  for (pAVar16 = (AddrManImpl *)local_f0._0_8_; pAVar16 != (AddrManImpl *)uVar24;
      pAVar16 = (AddrManImpl *)((long)&(pAVar16->cs).super_mutex.super___mutex_base._M_mutex + 8)) {
    lVar21 = (pAVar16->cs).super_mutex.super___mutex_base._M_mutex.__align;
    local_478 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_470 = "";
    local_488 = &boost::unit_test::basic_cstring<char_const>::null;
    local_480 = &boost::unit_test::basic_cstring<char_const>::null;
    file_08.m_end = (iterator)0x8a;
    file_08.m_begin = (iterator)&local_478;
    msg_08.m_end = pvVar14;
    msg_08.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_488,
               msg_08);
    bVar18 = CConnman::AddedNodesContain
                       ((CConnman *)
                        connman._M_t.
                        super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>
                        .super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,
                        (CAddress *)(lVar21 + 0x118));
    local_1d0._M_dataplus._M_p._0_1_ = bVar18;
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_allocated_capacity = 0;
    local_350._0_8_ = "connman->AddedNodesContain(node->addr)";
    local_350._8_8_ = "";
    debugloghelper18.m_message._M_string_length._0_1_ = 0;
    debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
    debugloghelper18.m_message.field_2._M_allocated_capacity =
         (size_type)boost::unit_test::lazy_ostream::inst;
    debugloghelper18.m_message.field_2._8_8_ = local_350;
    local_498 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_490 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1d0,(lazy_ostream *)&debugloghelper18,1,0,WARN,
               (check_type)puVar23,(size_t)&local_498,0x8a);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_1d0.field_2._M_allocated_capacity);
  }
  std::_Vector_base<CNode_*,_std::allocator<CNode_*>_>::~_Vector_base
            ((_Vector_base<CNode_*,_std::allocator<CNode_*>_> *)local_f0);
  p_Var22 = &local_1f8;
  local_1f8._M_engaged = false;
  pvVar13 = &DAT_00000001;
  address_04.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_string_length = (size_type)pcVar25;
  address_04.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._M_value._M_dataplus._M_p = (_Alloc_hider)(_Alloc_hider)p_Var22;
  address_04.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._16_8_ = in_stack_fffffffffffffae0;
  address_04.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._M_payload._24_8_ = this_02;
  address_04.
  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ._32_8_ = in_stack_fffffffffffffaf0;
  _Var12._M_t.super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
  super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl =
       (tuple<ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>)
       (tuple<ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>)connman;
  PeerTest::AddPeer(this_02,&id,&nodes,(PeerManager *)local_218,
                    (ConnmanTestMsg *)
                    connman._M_t.
                    super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t
                    .super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
                    super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,OUTBOUND_FULL_RELAY,
                    false,address_04);
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(&local_1f8);
  local_4a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_4a0 = "";
  local_4b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x8d;
  file_09.m_begin = (iterator)&local_4a8;
  msg_09.m_end = pvVar13;
  msg_09.m_begin =
       (iterator)
       _Var12._M_t.super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
       super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_4b8,
             msg_09);
  bVar18 = CConnman::AddedNodesContain
                     ((CConnman *)
                      connman._M_t.
                      super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>.
                      _M_t.
                      super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>
                      .super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,
                      &nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                       super__Vector_impl_data._M_finish[-1]->addr);
  local_f0[0] = !bVar18;
  local_f0._8_8_ = (__pthread_internal_list *)0x0;
  aStack_e0._M_allocated_capacity = 0;
  local_1d0._M_dataplus._M_p = "!connman->AddedNodesContain(nodes.back()->addr)";
  local_1d0._M_string_length = (long)"!connman->AddedNodesContain(nodes.back()->addr)" + 0x2f;
  debugloghelper18.m_message._M_string_length._0_1_ = 0;
  debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
  debugloghelper18.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper18.m_message.field_2._8_8_ = &local_1d0;
  local_4c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_4c0 = "";
  pvVar13 = &DAT_00000001;
  pvVar14 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_f0,(lazy_ostream *)&debugloghelper18,1,0,WARN,
             (check_type)p_Var22,(size_t)&local_4c8,0x8d);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_e0._M_allocated_capacity);
  local_f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_f0._8_8_ = "";
  aStack_e0._M_allocated_capacity = 0x8f;
  puVar8 = boost::unit_test::unit_test_log_t::operator<<
                     (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_f0);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_1d0,(log_level)puVar8);
  debugloghelper18.m_message._M_string_length._0_1_ = 0;
  debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0114a848;
  debugloghelper18.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper18.m_message.field_2._8_8_ = anon_var_dwarf_a51725;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_1d0,(lazy_ostream *)&debugloghelper18);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_1d0);
  CConnman::GetAddedNodeInfo
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)local_350,
             (CConnman *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,true);
  this_01 = (CService *)(local_350._0_8_ + 0x28);
  pAVar10 = (pointer)local_350._8_8_;
  while( true ) {
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0xbbf237;
    if ((pointer)(this_01 + -1) == pAVar10) break;
    local_1d0._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_1d0._M_string_length =
         (long)
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
         + 0x6b;
    local_1d0.field_2._M_allocated_capacity = 0x91;
    puVar8 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&local_1d0);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)local_3a0,(log_level)puVar8);
    tinyformat::format<std::__cxx11::string>
              ((string *)local_f0,(tinyformat *)"\nadded node: %s",(char *)(this_01 + -1),pbVar9);
    debugloghelper18.m_message._M_string_length._0_1_ = 0;
    debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01147fb0;
    debugloghelper18.m_message.field_2._M_allocated_capacity =
         (size_type)boost::unit_test::lazy_ostream::inst;
    debugloghelper18.m_message.field_2._8_8_ = (string *)local_f0;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)local_3a0,(lazy_ostream *)&debugloghelper18);
    std::__cxx11::string::~string((string *)local_f0);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)local_3a0);
    local_1d0._M_dataplus._M_p =
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_1d0._M_string_length =
         (long)
         "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
         + 0x6b;
    local_1d0.field_2._M_allocated_capacity = 0x92;
    puVar8 = boost::unit_test::unit_test_log_t::operator<<
                       (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&local_1d0);
    boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)local_3a0,(log_level)puVar8);
    tinyformat::format<bool>((string *)local_f0,"connected: %s",(bool *)(this_01 + 1));
    debugloghelper18.m_message._M_string_length._0_1_ = 0;
    debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01147fb0;
    debugloghelper18.m_message.field_2._M_allocated_capacity =
         (size_type)boost::unit_test::lazy_ostream::inst;
    debugloghelper18.m_message.field_2._8_8_ = (string *)local_f0;
    boost::unit_test::ut_detail::entry_value_collector::operator<<
              ((entry_value_collector *)local_3a0,(lazy_ostream *)&debugloghelper18);
    std::__cxx11::string::~string((string *)local_f0);
    boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
              ((entry_value_collector *)local_3a0);
    if ((bool)this_01[1].super_CNetAddr.m_addr._union.direct[0] == true) {
      local_3a0._0_8_ =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
      ;
      local_3a0._8_8_ = "";
      local_3a0._16_8_ = 0x94;
      puVar8 = boost::unit_test::unit_test_log_t::operator<<
                         (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_3a0)
      ;
      boost::unit_test::unit_test_log_t::operator()(&local_3a8,(log_level)puVar8);
      CService::ToStringAddrPort_abi_cxx11_(&local_1d0,this_01);
      tinyformat::format<std::__cxx11::string>
                ((string *)local_f0,(tinyformat *)"IP address: %s",(char *)&local_1d0,pbVar9);
      debugloghelper18.m_message._M_string_length._0_1_ = 0;
      debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01147fb0;
      debugloghelper18.m_message.field_2._M_allocated_capacity =
           (size_type)boost::unit_test::lazy_ostream::inst;
      debugloghelper18.m_message.field_2._8_8_ = (string *)local_f0;
      boost::unit_test::ut_detail::entry_value_collector::operator<<
                ((entry_value_collector *)&local_3a8,(lazy_ostream *)&debugloghelper18);
      std::__cxx11::string::~string((string *)local_f0);
      std::__cxx11::string::~string((string *)&local_1d0);
      boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                ((entry_value_collector *)&local_3a8);
      local_1d0._M_dataplus._M_p =
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
      ;
      local_1d0._M_string_length =
           (long)
           "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
           + 0x6b;
      local_1d0.field_2._M_allocated_capacity = 0x95;
      puVar8 = boost::unit_test::unit_test_log_t::operator<<
                         (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)&local_1d0
                         );
      boost::unit_test::unit_test_log_t::operator()(&local_3a8,(log_level)puVar8);
      local_3a0._0_8_ = "outbound";
      if (this_01[1].super_CNetAddr.m_addr._union.direct[1] != '\0') {
        local_3a0._0_8_ = "inbound";
      }
      tinyformat::format<char_const*>
                ((string *)local_f0,(tinyformat *)"direction: %s",(char *)local_3a0,
                 (char **)"inbound");
      debugloghelper18.m_message._M_string_length._0_1_ = 0;
      debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_01147fb0;
      debugloghelper18.m_message.field_2._M_allocated_capacity =
           (size_type)boost::unit_test::lazy_ostream::inst;
      debugloghelper18.m_message.field_2._8_8_ = (string *)local_f0;
      boost::unit_test::ut_detail::entry_value_collector::operator<<
                ((entry_value_collector *)&local_3a8,(lazy_ostream *)&debugloghelper18);
      std::__cxx11::string::~string((string *)local_f0);
      boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
                ((entry_value_collector *)&local_3a8);
    }
    this_01 = (CService *)((long)&this_01[2].super_CNetAddr.m_addr._union + 8);
  }
  std::vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_>::~vector
            ((vector<AddedNodeInfo,_std::allocator<AddedNodeInfo>_> *)local_350);
  local_f0._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
  ;
  local_f0._8_8_ = "";
  aStack_e0._M_allocated_capacity = 0x99;
  puVar8 = boost::unit_test::unit_test_log_t::operator<<
                     (boost::unit_test::(anonymous_namespace)::unit_test_log,(begin *)local_f0);
  boost::unit_test::unit_test_log_t::operator()((unit_test_log_t *)&local_1d0,(log_level)puVar8);
  debugloghelper18.m_message._M_string_length._0_1_ = 0;
  debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_0114a888;
  debugloghelper18.m_message.field_2._M_allocated_capacity =
       (size_type)boost::unit_test::lazy_ostream::inst;
  debugloghelper18.m_message.field_2._8_8_ = anon_var_dwarf_a517aa;
  boost::unit_test::ut_detail::entry_value_collector::operator<<
            ((entry_value_collector *)&local_1d0,(lazy_ostream *)&debugloghelper18);
  boost::unit_test::ut_detail::entry_value_collector::~entry_value_collector
            ((entry_value_collector *)&local_1d0);
  ConnmanTestMsg::TestNodes
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)local_f0,
             (ConnmanTestMsg *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl);
  uVar24 = local_f0._8_8_;
  for (pAVar16 = (AddrManImpl *)local_f0._0_8_; pAVar16 != (AddrManImpl *)uVar24;
      pAVar16 = (AddrManImpl *)((long)&(pAVar16->cs).super_mutex.super___mutex_base._M_mutex + 8)) {
    lVar21 = (pAVar16->cs).super_mutex.super___mutex_base._M_mutex.__align;
    local_4d8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_4d0 = "";
    local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
    local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
    file_10.m_end = (iterator)0x9b;
    file_10.m_begin = (iterator)&local_4d8;
    msg_10.m_end = pvVar14;
    msg_10.m_begin = pvVar13;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_4e8,
               msg_10);
    bVar18 = CConnman::AlreadyConnectedToAddress
                       ((CConnman *)
                        connman._M_t.
                        super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>
                        .super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl,
                        (CAddress *)(lVar21 + 0x118));
    local_1d0._M_dataplus._M_p._0_1_ = bVar18;
    local_1d0._M_string_length = 0;
    local_1d0.field_2._M_allocated_capacity = 0;
    local_350._0_8_ = "connman->AlreadyConnectedPublic(node->addr)";
    local_350._8_8_ = "";
    debugloghelper18.m_message._M_string_length._0_1_ = 0;
    debugloghelper18.m_message._M_dataplus._M_p = (pointer)&PTR__lazy_ostream_011481f0;
    debugloghelper18.m_message.field_2._M_allocated_capacity =
         (size_type)boost::unit_test::lazy_ostream::inst;
    debugloghelper18.m_message.field_2._8_8_ = local_350;
    local_4f8 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/net_peer_connection_tests.cpp"
    ;
    local_4f0 = "";
    pvVar13 = &DAT_00000001;
    pvVar14 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)&local_1d0,(lazy_ostream *)&debugloghelper18,1,0,WARN,
               (check_type)p_Var22,(size_t)&local_4f8,0x9b);
    boost::detail::shared_count::~shared_count
              ((shared_count *)&local_1d0.field_2._M_allocated_capacity);
  }
  std::_Vector_base<CNode_*,_std::allocator<CNode_*>_>::~_Vector_base
            ((_Vector_base<CNode_*,_std::allocator<CNode_*>_> *)local_f0);
  ConnmanTestMsg::TestNodes
            ((vector<CNode_*,_std::allocator<CNode_*>_> *)&debugloghelper18,
             (ConnmanTestMsg *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl);
  pcVar3 = (pointer)CONCAT71(debugloghelper18.m_message._M_string_length._1_7_,
                             (undefined1)debugloghelper18.m_message._M_string_length);
  for (_Var11 = debugloghelper18.m_message._M_dataplus; _Var11._M_p != pcVar3;
      _Var11._M_p = _Var11._M_p + 8) {
    (*((NetEventsInterface *)((long)local_218 + 8))->_vptr_NetEventsInterface[1])
              ((NetEventsInterface *)((long)local_218 + 8),*(undefined8 *)_Var11._M_p);
  }
  std::_Vector_base<CNode_*,_std::allocator<CNode_*>_>::~_Vector_base
            ((_Vector_base<CNode_*,_std::allocator<CNode_*>_> *)&debugloghelper18);
  ConnmanTestMsg::ClearTestNodes
            ((ConnmanTestMsg *)
             connman._M_t.
             super___uniq_ptr_impl<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>._M_t.
             super__Tuple_impl<0UL,_ConnmanTestMsg_*,_std::default_delete<ConnmanTestMsg>_>.
             super__Head_base<0UL,_ConnmanTestMsg_*,_false>._M_head_impl);
  std::_Vector_base<CNode_*,_std::allocator<CNode_*>_>::~_Vector_base
            (&nodes.super__Vector_base<CNode_*,_std::allocator<CNode_*>_>);
  if (local_218 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)local_218 + 0x58))();
  }
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::~unique_ptr(&connman);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_FIXTURE_TEST_CASE(test_addnode_getaddednodeinfo_and_connection_detection, PeerTest)
{
    auto connman = std::make_unique<ConnmanTestMsg>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerman = PeerManager::make(*connman, *m_node.addrman, nullptr, *m_node.chainman, *m_node.mempool, *m_node.warnings, {});
    NodeId id{0};
    std::vector<CNode*> nodes;

    // Connect a localhost peer.
    {
        ASSERT_DEBUG_LOG("Added connection to 127.0.0.1:8333 peer=1");
        AddPeer(id, nodes, *peerman, *connman, ConnectionType::MANUAL, /*onion_peer=*/false, /*address=*/"127.0.0.1");
        BOOST_REQUIRE(nodes.back() != nullptr);
    }

    // Call ConnectNode(), which is also called by RPC addnode onetry, for a localhost
    // address that resolves to multiple IPs, including that of the connected peer.
    // The connection attempt should consistently fail due to the check in ConnectNode().
    for (int i = 0; i < 10; ++i) {
        ASSERT_DEBUG_LOG("Not opening a connection to localhost, already connected to 127.0.0.1:8333");
        BOOST_CHECK(!connman->ConnectNodePublic(*peerman, "localhost", ConnectionType::MANUAL));
    }

    // Add 3 more peer connections.
    AddPeer(id, nodes, *peerman, *connman, ConnectionType::OUTBOUND_FULL_RELAY);
    AddPeer(id, nodes, *peerman, *connman, ConnectionType::BLOCK_RELAY, /*onion_peer=*/true);
    AddPeer(id, nodes, *peerman, *connman, ConnectionType::INBOUND);

    // Add a CJDNS peer connection.
    AddPeer(id, nodes, *peerman, *connman, ConnectionType::INBOUND, /*onion_peer=*/false,
            /*address=*/"[fc00:3344:5566:7788:9900:aabb:ccdd:eeff]:1234");
    BOOST_CHECK(nodes.back()->IsInboundConn());
    BOOST_CHECK_EQUAL(nodes.back()->ConnectedThroughNetwork(), Network::NET_CJDNS);

    BOOST_TEST_MESSAGE("Call AddNode() for all the peers");
    for (auto node : connman->TestNodes()) {
        BOOST_CHECK(connman->AddNode({/*m_added_node=*/node->addr.ToStringAddrPort(), /*m_use_v2transport=*/true}));
        BOOST_TEST_MESSAGE(strprintf("peer id=%s addr=%s", node->GetId(), node->addr.ToStringAddrPort()));
    }

    BOOST_TEST_MESSAGE("\nCall AddNode() with 2 addrs resolving to existing localhost addnode entry; neither should be added");
    BOOST_CHECK(!connman->AddNode({/*m_added_node=*/"127.0.0.1", /*m_use_v2transport=*/true}));
    // OpenBSD doesn't support the IPv4 shorthand notation with omitted zero-bytes.
#if !defined(__OpenBSD__)
    BOOST_CHECK(!connman->AddNode({/*m_added_node=*/"127.1", /*m_use_v2transport=*/true}));
#endif

    BOOST_TEST_MESSAGE("\nExpect GetAddedNodeInfo to return expected number of peers with `include_connected` true/false");
    BOOST_CHECK_EQUAL(connman->GetAddedNodeInfo(/*include_connected=*/true).size(), nodes.size());
    BOOST_CHECK(connman->GetAddedNodeInfo(/*include_connected=*/false).empty());

    // Test AddedNodesContain()
    for (auto node : connman->TestNodes()) {
        BOOST_CHECK(connman->AddedNodesContain(node->addr));
    }
    AddPeer(id, nodes, *peerman, *connman, ConnectionType::OUTBOUND_FULL_RELAY);
    BOOST_CHECK(!connman->AddedNodesContain(nodes.back()->addr));

    BOOST_TEST_MESSAGE("\nPrint GetAddedNodeInfo contents:");
    for (const auto& info : connman->GetAddedNodeInfo(/*include_connected=*/true)) {
        BOOST_TEST_MESSAGE(strprintf("\nadded node: %s", info.m_params.m_added_node));
        BOOST_TEST_MESSAGE(strprintf("connected: %s", info.fConnected));
        if (info.fConnected) {
            BOOST_TEST_MESSAGE(strprintf("IP address: %s", info.resolvedAddress.ToStringAddrPort()));
            BOOST_TEST_MESSAGE(strprintf("direction: %s", info.fInbound ? "inbound" : "outbound"));
        }
    }

    BOOST_TEST_MESSAGE("\nCheck that all connected peers are correctly detected as connected");
    for (auto node : connman->TestNodes()) {
        BOOST_CHECK(connman->AlreadyConnectedPublic(node->addr));
    }

    // Clean up
    for (auto node : connman->TestNodes()) {
        peerman->FinalizeNode(*node);
    }
    connman->ClearTestNodes();
}